

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

reference __thiscall
andres::View<float,_false,_std::allocator<unsigned_long>_>::operator()
          (View<float,_false,_std::allocator<unsigned_long>_> *this,size_t value)

{
  reference pfVar1;
  runtime_error *this_00;
  size_t offset;
  size_t local_20;
  
  testInvariant(this);
  pfVar1 = this->data_;
  if (pfVar1 == (reference)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Assertion failed.");
LAB_00145637:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->geometry_).dimension_ == 0) {
    if (value != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Assertion failed.");
      goto LAB_00145637;
    }
  }
  else {
    indexToOffset(this,value,&local_20);
    pfVar1 = this->data_ + local_20;
  }
  return pfVar1;
}

Assistant:

inline typename View<T, isConst, A>::reference
View<T, isConst, A>::operator()
(
    const std::size_t value
)
{
    testInvariant();
    if(dimension() == 0) {
        marray_detail::Assert(MARRAY_NO_ARG_TEST || value == 0);
        return data_[0];
    }
    else {
        std::size_t offset;
        indexToOffset(value, offset);
        return data_[offset];
    }
}